

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compression.cpp
# Opt level: O2

bool ZAP::supportsCompression(Compression compression)

{
  return compression < 2;
}

Assistant:

bool supportsCompression(Compression compression)
	{
		switch (compression)
		{
		case Compression::NONE: return true;
		#ifdef ZAP_COMPRESS_LZ4
		case Compression::LZ4: return true;
		#endif
		default: return false;
		}
	}